

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_peaks.cpp
# Opt level: O0

void trt_pose::parse::find_peaks_out_nchw
               (int *counts,int *peaks,float *input,int N,int C,int H,int W,int M,float threshold,
               int window_size)

{
  float *input_n;
  int *peaks_n;
  int *counts_n;
  int n;
  float threshold_local;
  int H_local;
  int C_local;
  int N_local;
  float *input_local;
  int *peaks_local;
  int *counts_local;
  
  for (counts_n._4_4_ = 0; counts_n._4_4_ < N; counts_n._4_4_ = counts_n._4_4_ + 1) {
    find_peaks_out_chw(counts + counts_n._4_4_ * C,peaks + counts_n._4_4_ * C * M * 2,
                       input + counts_n._4_4_ * C * H * W,C,H,W,M,threshold,window_size);
  }
  return;
}

Assistant:

void find_peaks_out_nchw(int *counts,        // C
                         int *peaks,         // CxMx2
                         const float *input, // CxHxW
                         const int N, const int C, const int H, const int W,
                         const int M, const float threshold,
                         const int window_size) {
  for (int n = 0; n < N; n++) {
    int *counts_n = &counts[n * C];
    int *peaks_n = &peaks[n * C * M * 2];
    const float *input_n = &input[n * C * H * W];
    find_peaks_out_chw(counts_n, peaks_n, input_n, C, H, W, M, threshold,
                       window_size);
  }
}